

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

int __thiscall Time::Time::toDate(Time *this,char *buffer,bool iso8601)

{
  int iVar1;
  double dVar2;
  time_t t;
  tm ekT;
  char *dayName [7];
  undefined8 local_98;
  char *monthName [12];
  bool iso8601_local;
  char *buffer_local;
  Time *this_local;
  
  if (buffer == (char *)0x0) {
    this_local._4_4_ = 0x1e;
  }
  else {
    memcpy(&local_98,&PTR_anon_var_dwarf_1aee1_0014e330,0x60);
    memcpy(&ekT.tm_zone,&PTR_anon_var_dwarf_1afb5_0014e390,0x38);
    memset(&t,0,0x38);
    dVar2 = preciseTime(this);
    makeUTCTime((long)dVar2,(tm *)&t);
    if (iso8601) {
      this_local._4_4_ =
           sprintf(buffer,"%04d-%02d-%02dT%02d:%02d:%02dZ",(ulong)(ekT.tm_mday + 0x76c),
                   (ulong)(ekT.tm_hour + 1),(ulong)(uint)ekT.tm_min,(ulong)(uint)ekT.tm_sec,t._4_4_,
                   (undefined4)t);
    }
    else {
      iVar1 = sprintf(buffer,"%s, %02d %s %04d %02d:%02d:%02d %s",dayName[(long)ekT.tm_mon + -1],
                      (ulong)(uint)ekT.tm_min,monthName[(long)ekT.tm_hour + -1],
                      (ulong)(ekT.tm_mday + 0x76c),ekT.tm_sec,t._4_4_,(undefined4)t,"GMT");
      this_local._4_4_ = iVar1 + 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Time::toDate(char * buffer, const bool iso8601) const
    {
#if defined(_WIN32) || defined(_POSIX)
        if (!buffer) return 30;
        const char * monthName[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
        const char * dayName[] = { "Sun", "Mon", "Tue", "Wed", "Thr", "Fri", "Sat" };
        
        struct tm ekT = {0};
        time_t t = (time_t)preciseTime();
        makeUTCTime(t, ekT);
        if (iso8601)
            return sprintf(buffer, "%04d-%02d-%02dT%02d:%02d:%02dZ", ekT.tm_year + 1900, ekT.tm_mon + 1, ekT.tm_mday, ekT.tm_hour, ekT.tm_min, ekT.tm_sec);
        return sprintf(buffer, "%s, %02d %s %04d %02d:%02d:%02d %s", dayName[ekT.tm_wday], ekT.tm_mday, monthName[ekT.tm_mon], ekT.tm_year + 1900, ekT.tm_hour, ekT.tm_min, ekT.tm_sec, "GMT") + 1;
#else
        if (iso8601)
            return sprintf(buffer, "1970-01-01T00:00:00Z");
        strcpy(buffer, "Sun, 01 Jan 1970 00:00:00 GMT");
        return strlen(buffer);
#endif        
    }